

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_call_bound_function
                  (JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,int flags
                  )

{
  undefined8 *puVar1;
  JSValueUnion *pJVar2;
  undefined8 uVar3;
  void *pvVar4;
  undefined4 in_EAX;
  int iVar5;
  BOOL BVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  JSValueUnion JVar12;
  undefined4 *puVar13;
  JSValue JVar14;
  JSValue JVar15;
  long alStack_50 [3];
  undefined8 uStack_38;
  
  pJVar2 = *(JSValueUnion **)((long)func_obj.u.ptr + 0x30);
  iVar5 = pJVar2[4].int32;
  lVar9 = (long)(iVar5 + argc);
  if (&stack0xfffffffffffffff8 + lVar9 * -0x10 < (undefined1 *)ctx->rt->stack_limit) {
    alStack_50[2] = 0x1142b1;
    JS_ThrowStackOverflow(ctx);
    JVar14 = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    uStack_38 = CONCAT44(iVar5 + argc,in_EAX);
    puVar13 = (undefined4 *)((long)&uStack_38 + lVar9 * 0xfffffffffffffffc * 4);
    lVar10 = 0;
    for (lVar11 = 0; lVar11 < iVar5; lVar11 = lVar11 + 1) {
      puVar1 = (undefined8 *)((long)pJVar2 + lVar10 + 0x28);
      uVar3 = puVar1[1];
      *(undefined8 *)((long)puVar13 + lVar10) = *puVar1;
      ((undefined8 *)((long)puVar13 + lVar10))[1] = uVar3;
      lVar10 = lVar10 + 0x10;
    }
    uVar7 = 0;
    uVar8 = (ulong)(uint)argc;
    if (argc < 1) {
      uVar8 = uVar7;
    }
    for (; uVar8 * 0x10 != uVar7; uVar7 = uVar7 + 0x10) {
      puVar1 = (undefined8 *)((long)&argv->u + uVar7);
      uVar3 = puVar1[1];
      *(undefined8 *)(puVar13 + (long)iVar5 * 4) = *puVar1;
      *(undefined8 *)((long)(puVar13 + (long)iVar5 * 4) + 8) = uVar3;
      iVar5 = iVar5 + 1;
    }
    if ((flags & 1U) == 0) {
      JVar14 = *(JSValue *)pJVar2;
      JVar15 = *(JSValue *)(pJVar2 + 2);
      iVar5 = uStack_38._4_4_;
      alStack_50[lVar9 * -2 + 1] = (long)puVar13;
      alStack_50[lVar9 * -2] = 0x114354;
      JVar14 = JS_Call(ctx,JVar14,JVar15,iVar5,(JSValue *)alStack_50[lVar9 * -2 + 1]);
    }
    else {
      alStack_50[lVar9 * -2 + 2] = 0x114364;
      BVar6 = js_same_value(ctx,func_obj,this_obj);
      JVar14 = *(JSValue *)pJVar2;
      JVar12 = this_obj.u;
      pvVar4 = (void *)this_obj.tag;
      if (BVar6 != 0) {
        JVar12.ptr = pJVar2->ptr;
        pvVar4 = pJVar2[1].ptr;
      }
      iVar5 = uStack_38._4_4_;
      alStack_50[lVar9 * -2 + 1] = (long)puVar13;
      alStack_50[lVar9 * -2] = 0x11438e;
      JVar15.tag = (int64_t)pvVar4;
      JVar15.u.float64 = JVar12.float64;
      JVar14 = JS_CallConstructor2(ctx,JVar14,JVar15,iVar5,(JSValue *)alStack_50[lVar9 * -2 + 1]);
    }
  }
  return JVar14;
}

Assistant:

static JSValue js_call_bound_function(JSContext *ctx, JSValueConst func_obj,
                                      JSValueConst this_obj,
                                      int argc, JSValueConst *argv, int flags)
{
    JSObject *p;
    JSBoundFunction *bf;
    JSValueConst *arg_buf, new_target;
    int arg_count, i;

    p = JS_VALUE_GET_OBJ(func_obj);
    bf = p->u.bound_function;
    arg_count = bf->argc + argc;
    if (js_check_stack_overflow(ctx->rt, sizeof(JSValue) * arg_count))
        return JS_ThrowStackOverflow(ctx);
    arg_buf = alloca(sizeof(JSValue) * arg_count);
    for(i = 0; i < bf->argc; i++) {
        arg_buf[i] = bf->argv[i];
    }
    for(i = 0; i < argc; i++) {
        arg_buf[bf->argc + i] = argv[i];
    }
    if (flags & JS_CALL_FLAG_CONSTRUCTOR) {
        new_target = this_obj;
        if (js_same_value(ctx, func_obj, new_target))
            new_target = bf->func_obj;
        return JS_CallConstructor2(ctx, bf->func_obj, new_target,
                                   arg_count, arg_buf);
    } else {
        return JS_Call(ctx, bf->func_obj, bf->this_val,
                       arg_count, arg_buf);
    }
}